

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

color_quad_u8 __thiscall crnlib::dxt_image::get_pixel(dxt_image *this,uint x,uint y)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint16 uVar4;
  uint16 packed_delta3;
  uint block_x_00;
  uint block_y_00;
  uint uVar5;
  uint uVar6;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar7;
  uint uVar8;
  uint uVar9;
  etc1_block *this_00;
  dxt1_block *this_01;
  dxt5_block *this_02;
  dxt3_block *this_03;
  uchar *puVar10;
  uint in_ECX;
  undefined4 in_register_00000034;
  dxt_image *this_04;
  color_quad<unsigned_char,_int> *local_110;
  color_quad<unsigned_char,_int> *local_f8;
  dxt3_block *pBlock_2;
  int comp_index_1;
  uint s_1;
  uint h_1;
  uint l_1;
  dxt5_block *pBlock_1;
  int comp_index;
  uint s;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint h;
  uint l;
  dxt1_block *pBlock;
  uint selector_index;
  uint by;
  uint bx;
  uint16 base_color4_1;
  uint16 base_color4_0;
  uint16 delta_color3;
  uint16 base_color5;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  uint table_index1;
  uint table_index0;
  bool flip_flag;
  bool diff_flag;
  etc1_block *block;
  uint element_index;
  element *pElement;
  uint block_y;
  uint block_x;
  uint y_local;
  uint x_local;
  dxt_image *this_local;
  color_quad_u8 *result;
  
  this_04 = (dxt_image *)CONCAT44(in_register_00000034,x);
  block_x_00 = y >> 2;
  block_y_00 = in_ECX >> 2;
  get_element(this_04,block_x_00,block_y_00,0);
  color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)this,0,0,0,0xff);
  for (block._4_4_ = 0; block._4_4_ < this_04->m_num_elements_per_block;
      block._4_4_ = block._4_4_ + 1) {
    switch(this_04->m_element_type[block._4_4_]) {
    case cColorDXT1:
      this_01 = (dxt1_block *)get_element(this_04,block_x_00,block_y_00,block._4_4_);
      aVar7.m_u32 = dxt1_block::get_low_color(this_01);
      c1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   dxt1_block::get_high_color(this_01);
      dxt1_block::unpack_color((dxt1_block *)&s,(uint16)aVar7.m_u32,true,0xff);
      dxt1_block::unpack_color((dxt1_block *)&comp_index,c1.field_0._0_2_,true,0xff);
      uVar5 = dxt1_block::get_selector(this_01,y & 3,in_ECX & 3);
      if ((uint)c1.field_0 < (uint)aVar7) {
        switch(uVar5) {
        case 0:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,(uint)(byte)s,(uint)s._1_1_,
                     (uint)s._2_1_);
          break;
        case 1:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,(uint)(byte)comp_index,
                     (uint)comp_index._1_1_,(uint)comp_index._2_1_);
          break;
        case 2:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,
                     ((uint)(byte)s * 2 + (uint)(byte)comp_index) / 3,
                     ((uint)s._1_1_ * 2 + (uint)comp_index._1_1_) / 3,
                     ((uint)s._2_1_ * 2 + (uint)comp_index._2_1_) / 3);
          break;
        case 3:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,
                     ((uint)(byte)comp_index * 2 + (uint)(byte)s) / 3,
                     ((uint)comp_index._1_1_ * 2 + (uint)s._1_1_) / 3,
                     ((uint)comp_index._2_1_ * 2 + (uint)s._2_1_) / 3);
        }
      }
      else {
        switch(uVar5) {
        case 0:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,(uint)(byte)s,(uint)s._1_1_,
                     (uint)s._2_1_);
          break;
        case 1:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,(uint)(byte)comp_index,
                     (uint)comp_index._1_1_,(uint)comp_index._2_1_);
          break;
        case 2:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    ((color_quad<unsigned_char,_int> *)this,
                     (int)((uint)(byte)s + (uint)(byte)comp_index) >> 1,
                     (int)((uint)s._1_1_ + (uint)comp_index._1_1_) >> 1,
                     (int)((uint)s._2_1_ + (uint)comp_index._2_1_) >> 1);
          break;
        case 3:
          if (this_04->m_format < cDXT3) {
            color_quad<unsigned_char,_int>::set_noclamp_rgba
                      ((color_quad<unsigned_char,_int> *)this,0,0,0,0);
          }
          else {
            color_quad<unsigned_char,_int>::set_noclamp_rgb
                      ((color_quad<unsigned_char,_int> *)this,0,0,0);
          }
        }
      }
      break;
    case cAlphaDXT3:
      cVar1 = this_04->m_element_component_index[block._4_4_];
      this_03 = (dxt3_block *)get_element(this_04,block_x_00,block_y_00,block._4_4_);
      uVar5 = dxt3_block::get_alpha(this_03,y & 3,in_ECX & 3,true);
      puVar10 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)this,(int)cVar1);
      *puVar10 = (uchar)uVar5;
      break;
    case cAlphaDXT5:
      uVar5 = (uint)this_04->m_element_component_index[block._4_4_];
      this_02 = (dxt5_block *)get_element(this_04,block_x_00,block_y_00,block._4_4_);
      uVar6 = dxt5_block::get_low_alpha(this_02);
      uVar8 = dxt5_block::get_high_alpha(this_02);
      uVar9 = dxt5_block::get_selector(this_02,y & 3,in_ECX & 3);
      if (uVar8 < uVar6) {
        switch(uVar9) {
        case 0:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)uVar6;
          break;
        case 1:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)uVar8;
          break;
        case 2:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 6 + uVar8) / 7);
          break;
        case 3:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 5 + uVar8 * 2) / 7);
          break;
        case 4:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 4 + uVar8 * 3) / 7);
          break;
        case 5:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 3 + uVar8 * 4) / 7);
          break;
        case 6:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 2 + uVar8 * 5) / 7);
          break;
        case 7:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 + uVar8 * 6) / 7);
        }
      }
      else {
        switch(uVar9) {
        case 0:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)uVar6;
          break;
        case 1:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)uVar8;
          break;
        case 2:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 4 + uVar8) / 5);
          break;
        case 3:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 3 + uVar8 * 2) / 5);
          break;
        case 4:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 * 2 + uVar8 * 3) / 5);
          break;
        case 5:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = (uchar)((ulong)(uVar6 + uVar8 * 4) / 5);
          break;
        case 6:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = '\0';
          break;
        case 7:
          puVar10 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)this,uVar5);
          *puVar10 = 0xff;
        }
      }
      break;
    case cColorETC1:
      this_00 = (etc1_block *)get_element(this_04,block_x_00,block_y_00,block._4_4_);
      bVar2 = etc1_block::get_diff_bit(this_00);
      bVar3 = etc1_block::get_flip_bit(this_00);
      uVar5 = etc1_block::get_inten_table(this_00,0);
      uVar6 = etc1_block::get_inten_table(this_00,1);
      local_f8 = subblock_colors1 + 2;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_f8);
        local_f8 = local_f8 + 1;
      } while (local_f8 != subblock_colors0 + 2);
      local_110 = (color_quad<unsigned_char,_int> *)&base_color4_1;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_110);
        local_110 = local_110 + 1;
      } while (local_110 != subblock_colors1 + 2);
      if (bVar2) {
        uVar4 = etc1_block::get_base5_color(this_00);
        packed_delta3 = etc1_block::get_delta3_color(this_00);
        etc1_block::get_diff_subblock_colors(subblock_colors1 + 2,uVar4,uVar5);
        etc1_block::get_diff_subblock_colors
                  ((color_quad_u8 *)&base_color4_1,uVar4,packed_delta3,uVar6);
      }
      else {
        uVar4 = etc1_block::get_base4_color(this_00,0);
        etc1_block::get_abs_subblock_colors(subblock_colors1 + 2,uVar4,uVar5);
        uVar4 = etc1_block::get_base4_color(this_00,1);
        etc1_block::get_abs_subblock_colors((color_quad_u8 *)&base_color4_1,uVar4,uVar6);
      }
      uVar5 = etc1_block::get_selector(this_00,y & 3,in_ECX & 3);
      if (bVar3) {
        if ((in_ECX & 3) < 3) {
          color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)this,subblock_colors1 + (ulong)uVar5 + 2);
        }
        else {
          color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)this,
                     (color_quad<unsigned_char,_int> *)(&base_color4_1 + (ulong)uVar5 * 2));
        }
      }
      else if ((y & 3) < 3) {
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)this,subblock_colors1 + (ulong)uVar5 + 2);
      }
      else {
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)this,
                   (color_quad<unsigned_char,_int> *)(&base_color4_1 + (ulong)uVar5 * 2));
      }
    }
  }
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt_image::get_pixel(uint x, uint y) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element* pElement = reinterpret_cast<const element*>(&get_element(block_x, block_y, 0));

        color_quad_u8 result(0, 0, 0, 255);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                const uint selector_index = block.get_selector(bx, by);
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        result = subblock_colors0[selector_index];
                    }
                    else
                    {
                        result = subblock_colors1[selector_index];
                    }
                }
                else
                {
                    if (bx > 2)
                    {
                        result = subblock_colors1[selector_index];
                    }
                    else
                    {
                        result = subblock_colors0[selector_index];
                    }
                }

                break;
            }
            case cColorDXT1:
            {
                const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_color();
                const uint h = pBlock->get_high_color();

                color_quad_u8 c0(dxt1_block::unpack_color(static_cast<uint16>(l), true));
                color_quad_u8 c1(dxt1_block::unpack_color(static_cast<uint16>(h), true));

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3);
                        break;
                    case 3:
                        result.set_noclamp_rgb((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U);
                        break;
                    case 3:
                    {
                        if (m_format <= cDXT1A)
                        {
                            result.set_noclamp_rgba(0, 0, 0, 0);
                        }
                        else
                        {
                            result.set_noclamp_rgb(0, 0, 0);
                        }
                        break;
                    }
                    }
                }

                break;
            }
            case cAlphaDXT5:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_alpha();
                const uint h = pBlock->get_high_alpha();

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 6 + h) / 7);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 5 + h * 2) / 7);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 4 + h * 3) / 7);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 4) / 7);
                        break;
                    case 6:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 5) / 7);
                        break;
                    case 7:
                        result[comp_index] = static_cast<uint8>((l + h * 6) / 7);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 4 + h) / 5);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 2) / 5);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 3) / 5);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l + h * 4) / 5);
                        break;
                    case 6:
                        result[comp_index] = 0;
                        break;
                    case 7:
                        result[comp_index] = 255;
                        break;
                    }
                }

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

                result[comp_index] = static_cast<uint8>(pBlock->get_alpha(x & 3, y & 3, true));

                break;
            }
            default:
                break;
            }
        }

        return result;
    }